

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_workgraph.cpp
# Opt level: O1

bool dxil_spv::emit_finished_cross_group_sharing(Impl *impl,CallInst *inst)

{
  uint32_t uVar1;
  Id arg;
  Id IVar2;
  Builder *pBVar3;
  Operation *pOVar4;
  Operation *this;
  
  arg = SPIRVModule::get_helper_call_id(impl->spirv_module,FinishCrossGroupSharing,0);
  pBVar3 = Converter::Impl::builder(impl);
  IVar2 = spv::Builder::makeIntegerType(pBVar3,0x40,false);
  pOVar4 = Converter::Impl::allocate(impl,OpLoad,IVar2);
  Operation::add_id(pOVar4,(impl->node_input).private_bda_var_id);
  Converter::Impl::add(impl,pOVar4,false);
  pBVar3 = Converter::Impl::builder(impl);
  IVar2 = spv::Builder::makeIntegerType(pBVar3,0x40,false);
  this = Converter::Impl::allocate(impl,OpIAdd,IVar2);
  Operation::add_id(this,pOVar4->id);
  pBVar3 = Converter::Impl::builder(impl);
  uVar1 = (impl->node_input).payload_stride;
  IVar2 = spv::Builder::makeIntegerType(pBVar3,0x40,false);
  IVar2 = spv::Builder::makeInt64Constant(pBVar3,IVar2,(ulong)(uVar1 - 4),false);
  Operation::add_id(this,IVar2);
  Converter::Impl::add(impl,this,false);
  pBVar3 = Converter::Impl::builder(impl);
  IVar2 = spv::Builder::makeBoolType(pBVar3);
  pOVar4 = Converter::Impl::allocate(impl,OpFunctionCall,(Value *)inst,IVar2);
  Operation::add_id(pOVar4,arg);
  Operation::add_id(pOVar4,this->id);
  Converter::Impl::add(impl,pOVar4,false);
  return true;
}

Assistant:

bool emit_finished_cross_group_sharing(Converter::Impl &impl, const llvm::CallInst *inst)
{
	spv::Id call_id = impl.spirv_module.get_helper_call_id(HelperCall::FinishCrossGroupSharing);

	auto *load_op = impl.allocate(spv::OpLoad, impl.builder().makeUintType(64));
	load_op->add_id(impl.node_input.private_bda_var_id);
	impl.add(load_op);

	auto *add_op = impl.allocate(spv::OpIAdd, impl.builder().makeUintType(64));
	add_op->add_id(load_op->id);
	// Use the last 4 bytes of the node as the u32 cookie.
	// We don't have the node pointer type here, so this is the most convenient approach.
	add_op->add_id(impl.builder().makeUint64Constant(impl.node_input.payload_stride - 4));
	impl.add(add_op);

	auto *call_op = impl.allocate(spv::OpFunctionCall, inst, impl.builder().makeBoolType());
	call_op->add_id(call_id);
	call_op->add_id(add_op->id);
	impl.add(call_op);

	return true;
}